

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_storage.cpp
# Opt level: O0

tuple<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
 __thiscall
libtorrent::aux::file_piece_range_exclusive(aux *this,file_storage *fs,file_index_t file)

{
  bool bVar1;
  int iVar2;
  int64_t iVar3;
  peer_request pVar4;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_64;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_60;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_5c;
  piece_index_t end_piece;
  piece_index_t begin_piece;
  int64_t piece_size;
  int64_t file_size;
  int local_38;
  undefined8 local_2c;
  peer_request range;
  file_storage *fs_local;
  aux *paStack_10;
  file_index_t file_local;
  
  range._4_8_ = fs;
  fs_local._4_4_ = file.m_val;
  paStack_10 = this;
  pVar4 = file_storage::map_file(fs,file,0,1);
  file_size = pVar4._0_8_;
  local_2c = file_size;
  local_38 = pVar4.length;
  range.piece.m_val = local_38;
  iVar3 = file_storage::file_size((file_storage *)range._4_8_,fs_local._4_4_);
  iVar2 = file_storage::piece_length((file_storage *)range._4_8_);
  _end_piece = (long)iVar2;
  if (local_2c._4_4_ == 0) {
    local_5c.m_val = (int)local_2c;
  }
  else {
    iVar2 = strong_typedef::operator_cast_to_int((strong_typedef *)&local_2c);
    strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(&local_5c,iVar2 + 1)
    ;
  }
  iVar2 = file_storage::num_files((file_storage *)range._4_8_);
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::strong_typedef(&local_64,iVar2 + -1);
  bVar1 = strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator==
                    ((strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)
                     ((long)&fs_local + 4),&local_64);
  if (bVar1) {
    iVar2 = file_storage::num_pieces((file_storage *)range._4_8_);
    strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(&local_60,iVar2);
  }
  else {
    iVar2 = strong_typedef::operator_cast_to_int((strong_typedef *)&local_2c);
    strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef
              (&local_60,(int)((iVar2 * _end_piece + (long)local_2c._4_4_ + iVar3 + 1) / _end_piece)
              );
  }
  ::std::
  make_tuple<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&>
            ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)this,&local_5c);
  return (tuple<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
          )(_Tuple_impl<0UL,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
            )this;
}

Assistant:

std::tuple<piece_index_t, piece_index_t>
	file_piece_range_exclusive(file_storage const& fs, file_index_t const file)
	{
		peer_request const range = fs.map_file(file, 0, 1);
		std::int64_t const file_size = fs.file_size(file);
		std::int64_t const piece_size = fs.piece_length();
		piece_index_t const begin_piece = range.start == 0 ? range.piece : piece_index_t(static_cast<int>(range.piece) + 1);
		// the last piece is potentially smaller than the other pieces, so the
		// generic logic doesn't really work. If this file is the last file, the
		// last piece doesn't overlap with any other file and it's entirely
		// contained within the last file.
		piece_index_t const end_piece = (file == file_index_t(fs.num_files() - 1))
			? piece_index_t(fs.num_pieces())
			: piece_index_t(int((static_cast<int>(range.piece) * piece_size + range.start + file_size + 1) / piece_size));
		return std::make_tuple(begin_piece, end_piece);
	}